

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

void ucnv_convertEx_63(UConverter *targetCnv,UConverter *sourceCnv,char **target,char *targetLimit,
                      char **source,char *sourceLimit,UChar *pivotStart,UChar **pivotSource,
                      UChar **pivotTarget,UChar *pivotLimit,UBool reset,UBool flush,
                      UErrorCode *pErrorCode)

{
  char *pcVar1;
  char *pcVar2;
  UBool UVar3;
  UConverterConvert local_8d0;
  UConverterConvert convert;
  UConverterFromUnicodeArgs fromUArgs;
  UConverterToUnicodeArgs toUArgs;
  char *t;
  char *s;
  UChar *myPivotTarget;
  UChar *myPivotSource;
  UChar pivotBuffer [1024];
  char *sourceLimit_local;
  char **source_local;
  char *targetLimit_local;
  char **target_local;
  UConverter *sourceCnv_local;
  UConverter *targetCnv_local;
  
  if ((pErrorCode != (UErrorCode *)0x0) &&
     (pivotBuffer._2040_8_ = sourceLimit, UVar3 = U_FAILURE(*pErrorCode), UVar3 == '\0')) {
    if (((targetCnv == (UConverter *)0x0) ||
        (((sourceCnv == (UConverter *)0x0 || (source == (char **)0x0)) || (*source == (char *)0x0)))
        ) || (((target == (char **)0x0 || (*target == (char *)0x0)) || (targetLimit == (char *)0x0))
             )) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      pcVar1 = *source;
      pcVar2 = *target;
      if (((pivotBuffer._2040_8_ == 0) || (pcVar1 <= (ulong)pivotBuffer._2040_8_)) &&
         (pcVar2 <= targetLimit)) {
        if ((((pivotBuffer._2040_8_ == 0) ||
             ((ulong)(pivotBuffer._2040_8_ - (long)pcVar1) < 0x80000000)) ||
            ((ulong)pivotBuffer._2040_8_ <= pcVar1)) &&
           (((ulong)((long)targetLimit - (long)pcVar2) < 0x80000000 || (targetLimit <= pcVar2)))) {
          if (pivotStart == (UChar *)0x0) {
            if (flush == '\0') {
              *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
              return;
            }
            pivotStart = (UChar *)&myPivotSource;
            pivotSource = &myPivotTarget;
            pivotTarget = (UChar **)&s;
            pivotLimit = pivotBuffer + 0x3fc;
            s = (char *)pivotStart;
            myPivotTarget = pivotStart;
          }
          else if (((pivotLimit <= pivotStart) || (pivotSource == (UChar **)0x0)) ||
                  ((*pivotSource == (UChar *)0x0 ||
                   (((pivotTarget == (UChar **)0x0 || (*pivotTarget == (UChar *)0x0)) ||
                    (pivotLimit == (UChar *)0x0)))))) {
            *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return;
          }
          if (pivotBuffer._2040_8_ == 0) {
            pivotBuffer._2040_8_ = strchr(*source,0);
          }
          if (reset == '\0') {
            if ('\0' < targetCnv->charErrorBufferLength) {
              UVar3 = ucnv_outputOverflowFromUnicode
                                (targetCnv,target,targetLimit,(int32_t **)0x0,pErrorCode);
              if (UVar3 != '\0') {
                return;
              }
              if ((((flush == '\0') && (-1 < targetCnv->preFromULength)) &&
                  ((*pivotSource == *pivotTarget &&
                   ((sourceCnv->UCharErrorBufferLength == '\0' && (-1 < sourceCnv->preToULength)))))
                  ) && (pcVar1 == (char *)pivotBuffer._2040_8_)) {
                return;
              }
            }
          }
          else {
            ucnv_resetToUnicode_63(sourceCnv);
            ucnv_resetFromUnicode_63(targetCnv);
            *pivotTarget = pivotStart;
            *pivotSource = pivotStart;
          }
          if ((sourceCnv->sharedData->staticData->conversionType == '\x04') &&
             (targetCnv->sharedData->impl->fromUTF8 != (UConverterConvert)0x0)) {
            local_8d0 = targetCnv->sharedData->impl->fromUTF8;
          }
          else if ((targetCnv->sharedData->staticData->conversionType == '\x04') &&
                  (sourceCnv->sharedData->impl->toUTF8 != (UConverterConvert)0x0)) {
            local_8d0 = sourceCnv->sharedData->impl->toUTF8;
          }
          else {
            local_8d0 = (UConverterConvert)0x0;
          }
          if ((local_8d0 != (UConverterConvert)0x0) &&
             (0x20 < (long)pivotLimit - (long)pivotStart >> 1)) {
            pivotLimit = pivotStart + 0x20;
          }
          convert._2_1_ = '\0';
          fromUArgs.targetLimit = (char *)0x0;
          fromUArgs.sourceLimit = (UChar *)*target;
          convert._0_2_ = 0x38;
          fromUArgs.offsets._2_1_ = flush;
          fromUArgs.offsets._0_2_ = 0x38;
          fromUArgs._0_8_ = targetCnv;
          fromUArgs.target = targetLimit;
LAB_00417b3e:
          while( true ) {
            if ((((*pivotSource < *pivotTarget) || (UVar3 = U_FAILURE(*pErrorCode), UVar3 != '\0'))
                || (targetCnv->preFromULength < '\0')) || (convert._2_1_ != '\0')) {
              fromUArgs.converter = (UConverter *)*pivotSource;
              fromUArgs.source = *pivotTarget;
              _fromUnicodeWithCallback((UConverterFromUnicodeArgs *)&convert,pErrorCode);
              UVar3 = U_FAILURE(*pErrorCode);
              if (UVar3 != '\0') {
                *pivotSource = (UChar *)fromUArgs.converter;
                goto LAB_00417e00;
              }
            }
            *pivotTarget = pivotStart;
            *pivotSource = pivotStart;
            if (sourceCnv->UCharErrorBufferLength < '\x01') break;
            UVar3 = ucnv_outputOverflowToUnicode
                              (sourceCnv,pivotTarget,pivotLimit,(int32_t **)0x0,pErrorCode);
            if (UVar3 != '\0') {
              *pErrorCode = U_ZERO_ERROR;
            }
          }
          if (((pcVar1 == (char *)pivotBuffer._2040_8_) && (-1 < sourceCnv->preToULength)) &&
             ((sourceCnv->toULength == '\0' && ((flush == '\0' || (convert._2_1_ != '\0'))))))
          goto LAB_00417e00;
          if ((local_8d0 != (UConverterConvert)0x0) &&
             ((targetCnv->preFromUFirstCP < 0 && (sourceCnv->preToULength == '\0')))) {
            if (*pErrorCode == U_USING_DEFAULT_WARNING) {
              *pErrorCode = U_ZERO_ERROR;
            }
            (*local_8d0)((UConverterFromUnicodeArgs *)&convert,
                         (UConverterToUnicodeArgs *)&fromUArgs.offsets,pErrorCode);
            if (*pErrorCode == U_BUFFER_OVERFLOW_ERROR) goto LAB_00417e00;
            UVar3 = U_FAILURE(*pErrorCode);
            if (UVar3 != '\0') {
              if ('\0' < sourceCnv->toULength) goto LAB_00417d60;
              *pivotTarget = pivotStart + 1;
              *pivotSource = pivotStart + 1;
              goto LAB_00417b3e;
            }
            if (*pErrorCode == U_USING_DEFAULT_WARNING) {
              *pErrorCode = U_ZERO_ERROR;
              goto LAB_00417d60;
            }
            if ((flush == '\0') || (sourceCnv->toULength < '\x01')) {
              if (flush != '\0') {
                _reset(sourceCnv,UCNV_RESET_TO_UNICODE,'\0');
                _reset(targetCnv,UCNV_RESET_FROM_UNICODE,'\0');
              }
LAB_00417e00:
              *source = pcVar1;
              *target = (char *)fromUArgs.sourceLimit;
              if (flush == '\0') {
                return;
              }
              UVar3 = U_SUCCESS(*pErrorCode);
              if (UVar3 == '\0') {
                return;
              }
              if (*target == targetLimit) {
                *pErrorCode = U_STRING_NOT_TERMINATED_WARNING;
                return;
              }
              **target = '\0';
              if (*pErrorCode != U_STRING_NOT_TERMINATED_WARNING) {
                return;
              }
              *pErrorCode = U_ZERO_ERROR;
              return;
            }
            *pErrorCode = U_TRUNCATED_CHAR_FOUND;
          }
LAB_00417d60:
          _toUnicodeWithCallback((UConverterToUnicodeArgs *)&fromUArgs.offsets,pErrorCode);
          *pivotTarget = pivotStart;
          if (*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
            *pErrorCode = U_ZERO_ERROR;
          }
          else {
            UVar3 = U_FAILURE(*pErrorCode);
            if ((UVar3 != '\0') || ((flush == '\0' && (*pivotTarget == pivotStart))))
            goto LAB_00417e00;
          }
          if ((((flush != '\0') && (pcVar1 == (char *)pivotBuffer._2040_8_)) &&
              (-1 < sourceCnv->preToULength)) && (sourceCnv->UCharErrorBufferLength == '\0')) {
            convert._2_1_ = '\x01';
          }
          goto LAB_00417b3e;
        }
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      }
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucnv_convertEx(UConverter *targetCnv, UConverter *sourceCnv,
               char **target, const char *targetLimit,
               const char **source, const char *sourceLimit,
               UChar *pivotStart, UChar **pivotSource,
               UChar **pivotTarget, const UChar *pivotLimit,
               UBool reset, UBool flush,
               UErrorCode *pErrorCode) {
    UChar pivotBuffer[CHUNK_SIZE];
    const UChar *myPivotSource;
    UChar *myPivotTarget;
    const char *s;
    char *t;

    UConverterToUnicodeArgs toUArgs;
    UConverterFromUnicodeArgs fromUArgs;
    UConverterConvert convert;

    /* error checking */
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return;
    }

    if( targetCnv==NULL || sourceCnv==NULL ||
        source==NULL || *source==NULL ||
        target==NULL || *target==NULL || targetLimit==NULL
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    s=*source;
    t=*target;
    if((sourceLimit!=NULL && sourceLimit<s) || targetLimit<t) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    /*
     * Make sure that the buffer sizes do not exceed the number range for
     * int32_t. See ucnv_toUnicode() for a more detailed comment.
     */
    if(
        (sourceLimit!=NULL && ((size_t)(sourceLimit-s)>(size_t)0x7fffffff && sourceLimit>s)) ||
        ((size_t)(targetLimit-t)>(size_t)0x7fffffff && targetLimit>t)
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    
    if(pivotStart==NULL) {
        if(!flush) {
            /* streaming conversion requires an explicit pivot buffer */
            *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }

        /* use the stack pivot buffer */
        myPivotSource=myPivotTarget=pivotStart=pivotBuffer;
        pivotSource=(UChar **)&myPivotSource;
        pivotTarget=&myPivotTarget;
        pivotLimit=pivotBuffer+CHUNK_SIZE;
    } else if(  pivotStart>=pivotLimit ||
                pivotSource==NULL || *pivotSource==NULL ||
                pivotTarget==NULL || *pivotTarget==NULL ||
                pivotLimit==NULL
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    if(sourceLimit==NULL) {
        /* get limit of single-byte-NUL-terminated source string */
        sourceLimit=uprv_strchr(*source, 0);
    }

    if(reset) {
        ucnv_resetToUnicode(sourceCnv);
        ucnv_resetFromUnicode(targetCnv);
        *pivotSource=*pivotTarget=pivotStart;
    } else if(targetCnv->charErrorBufferLength>0) {
        /* output the targetCnv overflow buffer */
        if(ucnv_outputOverflowFromUnicode(targetCnv, target, targetLimit, NULL, pErrorCode)) {
            /* U_BUFFER_OVERFLOW_ERROR */
            return;
        }
        /* *target has moved, therefore stop using t */

        if( !flush &&
            targetCnv->preFromULength>=0 && *pivotSource==*pivotTarget &&
            sourceCnv->UCharErrorBufferLength==0 && sourceCnv->preToULength>=0 && s==sourceLimit
        ) {
            /* the fromUnicode overflow buffer is emptied and there is no new input: we are done */
            return;
        }
    }

    /* Is direct-UTF-8 conversion available? */
    if( sourceCnv->sharedData->staticData->conversionType==UCNV_UTF8 &&
        targetCnv->sharedData->impl->fromUTF8!=NULL
    ) {
        convert=targetCnv->sharedData->impl->fromUTF8;
    } else if( targetCnv->sharedData->staticData->conversionType==UCNV_UTF8 &&
               sourceCnv->sharedData->impl->toUTF8!=NULL
    ) {
        convert=sourceCnv->sharedData->impl->toUTF8;
    } else {
        convert=NULL;
    }

    /*
     * If direct-UTF-8 conversion is available, then we use a smaller
     * pivot buffer for error handling and partial matches
     * so that we quickly return to direct conversion.
     *
     * 32 is large enough for UCNV_EXT_MAX_UCHARS and UCNV_ERROR_BUFFER_LENGTH.
     *
     * We could reduce the pivot buffer size further, at the cost of
     * buffer overflows from callbacks.
     * The pivot buffer should not be smaller than the maximum number of
     * fromUnicode extension table input UChars
     * (for m:n conversion, see
     * targetCnv->sharedData->mbcs.extIndexes[UCNV_EXT_COUNT_UCHARS])
     * or 2 for surrogate pairs.
     *
     * Too small a buffer can cause thrashing between pivoting and direct
     * conversion, with function call overhead outweighing the benefits
     * of direct conversion.
     */
    if(convert!=NULL && (pivotLimit-pivotStart)>32) {
        pivotLimit=pivotStart+32;
    }

    /* prepare the converter arguments */
    fromUArgs.converter=targetCnv;
    fromUArgs.flush=FALSE;
    fromUArgs.offsets=NULL;
    fromUArgs.target=*target;
    fromUArgs.targetLimit=targetLimit;
    fromUArgs.size=sizeof(fromUArgs);

    toUArgs.converter=sourceCnv;
    toUArgs.flush=flush;
    toUArgs.offsets=NULL;
    toUArgs.source=s;
    toUArgs.sourceLimit=sourceLimit;
    toUArgs.targetLimit=pivotLimit;
    toUArgs.size=sizeof(toUArgs);

    /*
     * TODO: Consider separating this function into two functions,
     * extracting exactly the conversion loop,
     * for readability and to reduce the set of visible variables.
     *
     * Otherwise stop using s and t from here on.
     */
    s=t=NULL;

    /*
     * conversion loop
     *
     * The sequence of steps in the loop may appear backward,
     * but the principle is simple:
     * In the chain of
     *   source - sourceCnv overflow - pivot - targetCnv overflow - target
     * empty out later buffers before refilling them from earlier ones.
     *
     * The targetCnv overflow buffer is flushed out only once before the loop.
     */
    for(;;) {
        /*
         * if(pivot not empty or error or replay or flush fromUnicode) {
         *   fromUnicode(pivot -> target);
         * }
         *
         * For pivoting conversion; and for direct conversion for
         * error callback handling and flushing the replay buffer.
         */
        if( *pivotSource<*pivotTarget ||
            U_FAILURE(*pErrorCode) ||
            targetCnv->preFromULength<0 ||
            fromUArgs.flush
        ) {
            fromUArgs.source=*pivotSource;
            fromUArgs.sourceLimit=*pivotTarget;
            _fromUnicodeWithCallback(&fromUArgs, pErrorCode);
            if(U_FAILURE(*pErrorCode)) {
                /* target overflow, or conversion error */
                *pivotSource=(UChar *)fromUArgs.source;
                break;
            }

            /*
             * _fromUnicodeWithCallback() must have consumed the pivot contents
             * (*pivotSource==*pivotTarget) since it returned with U_SUCCESS()
             */
        }

        /* The pivot buffer is empty; reset it so we start at pivotStart. */
        *pivotSource=*pivotTarget=pivotStart;

        /*
         * if(sourceCnv overflow buffer not empty) {
         *     move(sourceCnv overflow buffer -> pivot);
         *     continue;
         * }
         */
        /* output the sourceCnv overflow buffer */
        if(sourceCnv->UCharErrorBufferLength>0) {
            if(ucnv_outputOverflowToUnicode(sourceCnv, pivotTarget, pivotLimit, NULL, pErrorCode)) {
                /* U_BUFFER_OVERFLOW_ERROR */
                *pErrorCode=U_ZERO_ERROR;
            }
            continue;
        }

        /*
         * check for end of input and break if done
         *
         * Checking both flush and fromUArgs.flush ensures that the converters
         * have been called with the flush flag set if the ucnv_convertEx()
         * caller set it.
         */
        if( toUArgs.source==sourceLimit &&
            sourceCnv->preToULength>=0 && sourceCnv->toULength==0 &&
            (!flush || fromUArgs.flush)
        ) {
            /* done successfully */
            break;
        }

        /*
         * use direct conversion if available
         * but not if continuing a partial match
         * or flushing the toUnicode replay buffer
         */
        if(convert!=NULL && targetCnv->preFromUFirstCP<0 && sourceCnv->preToULength==0) {
            if(*pErrorCode==U_USING_DEFAULT_WARNING) {
                /* remove a warning that may be set by this function */
                *pErrorCode=U_ZERO_ERROR;
            }
            convert(&fromUArgs, &toUArgs, pErrorCode);
            if(*pErrorCode==U_BUFFER_OVERFLOW_ERROR) {
                break;
            } else if(U_FAILURE(*pErrorCode)) {
                if(sourceCnv->toULength>0) {
                    /*
                     * Fall through to calling _toUnicodeWithCallback()
                     * for callback handling.
                     *
                     * The pivot buffer will be reset with
                     *   *pivotSource=*pivotTarget=pivotStart;
                     * which indicates a toUnicode error to the caller
                     * (*pivotSource==pivotStart shows no pivot UChars consumed).
                     */
                } else {
                    /*
                     * Indicate a fromUnicode error to the caller
                     * (*pivotSource>pivotStart shows some pivot UChars consumed).
                     */
                    *pivotSource=*pivotTarget=pivotStart+1;
                    /*
                     * Loop around to calling _fromUnicodeWithCallbacks()
                     * for callback handling.
                     */
                    continue;
                }
            } else if(*pErrorCode==U_USING_DEFAULT_WARNING) {
                /*
                 * No error, but the implementation requested to temporarily
                 * fall back to pivoting.
                 */
                *pErrorCode=U_ZERO_ERROR;
            /*
             * The following else branches are almost identical to the end-of-input
             * handling in _toUnicodeWithCallback().
             * Avoid calling it just for the end of input.
             */
            } else if(flush && sourceCnv->toULength>0) { /* flush==toUArgs.flush */
                /*
                 * the entire input stream is consumed
                 * and there is a partial, truncated input sequence left
                 */

                /* inject an error and continue with callback handling */
                *pErrorCode=U_TRUNCATED_CHAR_FOUND;
            } else {
                /* input consumed */
                if(flush) {
                    /* reset the converters without calling the callback functions */
                    _reset(sourceCnv, UCNV_RESET_TO_UNICODE, FALSE);
                    _reset(targetCnv, UCNV_RESET_FROM_UNICODE, FALSE);
                }

                /* done successfully */
                break;
            }
        }
        
        /*
         * toUnicode(source -> pivot);
         *
         * For pivoting conversion; and for direct conversion for
         * error callback handling, continuing partial matches
         * and flushing the replay buffer.
         *
         * The pivot buffer is empty and reset.
         */
        toUArgs.target=pivotStart; /* ==*pivotTarget */
        /* toUArgs.targetLimit=pivotLimit; already set before the loop */
        _toUnicodeWithCallback(&toUArgs, pErrorCode);
        *pivotTarget=toUArgs.target;
        if(*pErrorCode==U_BUFFER_OVERFLOW_ERROR) {
            /* pivot overflow: continue with the conversion loop */
            *pErrorCode=U_ZERO_ERROR;
        } else if(U_FAILURE(*pErrorCode) || (!flush && *pivotTarget==pivotStart)) {
            /* conversion error, or there was nothing left to convert */
            break;
        }
        /*
         * else:
         * _toUnicodeWithCallback() wrote into the pivot buffer,
         * continue with fromUnicode conversion.
         *
         * Set the fromUnicode flush flag if we flush and if toUnicode has
         * processed the end of the input.
         */
        if( flush && toUArgs.source==sourceLimit &&
            sourceCnv->preToULength>=0 &&
            sourceCnv->UCharErrorBufferLength==0
        ) {
            fromUArgs.flush=TRUE;
        }
    }

    /*
     * The conversion loop is exited when one of the following is true:
     * - the entire source text has been converted successfully to the target buffer
     * - a target buffer overflow occurred
     * - a conversion error occurred
     */

    *source=toUArgs.source;
    *target=fromUArgs.target;

    /* terminate the target buffer if possible */
    if(flush && U_SUCCESS(*pErrorCode)) {
        if(*target!=targetLimit) {
            **target=0;
            if(*pErrorCode==U_STRING_NOT_TERMINATED_WARNING) {
                *pErrorCode=U_ZERO_ERROR;
            }
        } else {
            *pErrorCode=U_STRING_NOT_TERMINATED_WARNING;
        }
    }
}